

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formula.cpp
# Opt level: O0

void __thiscall
bal::Formula::add_parameter(Formula *this,string *key,string *name,string *value,bool b_quote)

{
  bool bVar1;
  string *psVar2;
  char *pcVar3;
  long lVar4;
  pointer ppVar5;
  string *local_140;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_100;
  _Self local_c0;
  _Self local_b8;
  iterator it;
  string local_a8 [55];
  byte local_71;
  string local_70 [32];
  string local_50 [8];
  string item;
  bool b_quote_local;
  string *value_local;
  string *name_local;
  string *key_local;
  Formula *this_local;
  
  local_71 = 0;
  it._M_node._7_1_ = 0;
  if (b_quote) {
    std::__cxx11::string::string(local_70,(string *)name);
    local_71 = 1;
    psVar2 = (string *)std::__cxx11::string::append((char *)local_70);
    pcVar3 = (char *)std::__cxx11::string::append(psVar2);
    local_140 = (string *)std::__cxx11::string::append(pcVar3);
  }
  else {
    std::__cxx11::string::string(local_a8,(string *)name);
    it._M_node._7_1_ = 1;
    psVar2 = (string *)std::__cxx11::string::append((char *)local_a8);
    local_140 = (string *)std::__cxx11::string::append(psVar2);
  }
  std::__cxx11::string::string(local_50,local_140);
  if ((it._M_node._7_1_ & 1) != 0) {
    std::__cxx11::string::~string(local_a8);
  }
  if ((local_71 & 1) != 0) {
    std::__cxx11::string::~string(local_70);
  }
  local_b8._M_node =
       (_Base_ptr)
       std::
       map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&this->parameters_,key);
  local_c0._M_node =
       (_Base_ptr)
       std::
       map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->parameters_);
  bVar1 = std::operator!=(&local_b8,&local_c0);
  if (bVar1) {
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->(&local_b8);
    lVar4 = std::__cxx11::string::size();
    if (lVar4 != 0) {
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->(&local_b8);
      std::__cxx11::string::append((char *)&ppVar5->second);
    }
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_b8);
    std::__cxx11::string::append((string *)&ppVar5->second);
  }
  else {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_100,key,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
    std::
    map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::insert(&this->parameters_,&local_100);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_100);
  }
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void Formula::add_parameter(const std::string& key, const std::string& name,
                       const std::string& value, const bool b_quote) {
        std::string item = (b_quote) ?
        std::string(name).append(": \"").append(value).append("\"") :
        std::string(name).append(": ").append(value);
        
        auto it = parameters_.find(key);
        if (it != parameters_.end()) {
            if (it->second.size() > 0) {
                it->second.append(", ");
            };
            it->second.append(item);
        } else {
            parameters_.insert({key, item});
        };
    }